

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bra86.c
# Opt level: O2

SizeT x86_Convert(Byte *data,SizeT size,UInt32 ip,UInt32 *state,int encoding)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  sbyte sVar4;
  UInt32 UVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  
  if (size < 5) {
    return 0;
  }
  uVar10 = *state & 7;
  lVar3 = 0;
LAB_0059d7b3:
  do {
    uVar8 = 0;
    while( true ) {
      iVar7 = (int)uVar8;
      if (data + (size - 4) <= data + uVar8 + lVar3) {
        UVar5 = 0;
        if (uVar8 < 3) {
          UVar5 = uVar10 >> ((byte)uVar8 & 0x1f);
        }
        *state = UVar5;
        return lVar3 + uVar8;
      }
      if ((data[uVar8 + lVar3] & 0xfe) == 0xe8) break;
      uVar8 = uVar8 + 1;
    }
    uVar9 = 0;
    if ((uVar8 < 3) && (bVar1 = (byte)uVar8 & 0x1f, uVar11 = uVar10 >> bVar1, uVar10 >> bVar1 != 0))
    {
      if ((uVar11 == 3 || 4 < uVar11) ||
         (uVar9 = uVar11, (byte)(data[uVar8 + 1 + (ulong)(uVar11 >> 1) + lVar3] + 1) < 2)) {
        uVar10 = uVar11 >> 1 | 4;
        lVar3 = lVar3 + uVar8 + 1;
        goto LAB_0059d7b3;
      }
    }
    if ((data[uVar8 + lVar3 + 4] + 1 & 0xfe) == 0) {
      iVar2 = (int)lVar3;
      iVar6 = ((-5 - ip) - iVar2) - iVar7;
      if (encoding != 0) {
        iVar6 = ip + 5 + iVar2 + iVar7;
      }
      uVar10 = iVar6 + ((uint)data[uVar8 + lVar3 + 1] |
                       (uint)data[uVar8 + lVar3 + 2] << 8 |
                       (uint)data[uVar8 + lVar3 + 3] << 0x10 | (uint)data[uVar8 + lVar3 + 4] << 0x18
                       );
      if ((uVar9 != 0) && (sVar4 = (sbyte)((uVar9 & 6) << 2), ((uVar10 >> sVar4) + 1 & 0xfe) == 0))
      {
        uVar10 = uVar10 ^ (0x100 << sVar4) - 1U;
        if (encoding == 0) {
          uVar10 = (uVar10 + ((-5 - ip) - iVar2)) - iVar7;
        }
        else {
          uVar10 = uVar10 + ip + 5 + iVar2 + iVar7;
        }
      }
      data[uVar8 + lVar3 + 1] = (Byte)uVar10;
      data[uVar8 + lVar3 + 2] = (Byte)(uVar10 >> 8);
      data[uVar8 + lVar3 + 3] = (Byte)(uVar10 >> 0x10);
      data[uVar8 + lVar3 + 4] = (Byte)((int)(uVar10 << 7) >> 0x1f);
      uVar10 = 0;
      lVar3 = lVar3 + uVar8 + 5;
    }
    else {
      uVar10 = uVar9 >> 1 | 4;
      lVar3 = lVar3 + uVar8 + 1;
    }
  } while( true );
}

Assistant:

SizeT x86_Convert(Byte *data, SizeT size, UInt32 ip, UInt32 *state, int encoding)
{
  SizeT pos = 0;
  UInt32 mask = *state & 7;
  if (size < 5)
    return 0;
  size -= 4;
  ip += 5;

  for (;;)
  {
    Byte *p = data + pos;
    const Byte *limit = data + size;
    for (; p < limit; p++)
      if ((*p & 0xFE) == 0xE8)
        break;

    {
      SizeT d = (SizeT)(p - data - pos);
      pos = (SizeT)(p - data);
      if (p >= limit)
      {
        *state = (d > 2 ? 0 : mask >> (unsigned)d);
        return pos;
      }
      if (d > 2)
        mask = 0;
      else
      {
        mask >>= (unsigned)d;
        if (mask != 0 && (mask > 4 || mask == 3 || Test86MSByte(p[(mask >> 1) + 1])))
        {
          mask = (mask >> 1) | 4;
          pos++;
          continue;
        }
      }
    }

    if (Test86MSByte(p[4]))
    {
      UInt32 v = ((UInt32)p[4] << 24) | ((UInt32)p[3] << 16) | ((UInt32)p[2] << 8) | ((UInt32)p[1]);
      UInt32 cur = ip + (UInt32)pos;
      pos += 5;
      if (encoding)
        v += cur;
      else
        v -= cur;
      if (mask != 0)
      {
        unsigned sh = (mask & 6) << 2;
        if (Test86MSByte((Byte)(v >> sh)))
        {
          v ^= (((UInt32)0x100 << sh) - 1);
          if (encoding)
            v += cur;
          else
            v -= cur;
        }
        mask = 0;
      }
      p[1] = (Byte)v;
      p[2] = (Byte)(v >> 8);
      p[3] = (Byte)(v >> 16);
      p[4] = (Byte)(0 - ((v >> 24) & 1));
    }
    else
    {
      mask = (mask >> 1) | 4;
      pos++;
    }
  }
}